

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  sbyte sVar4;
  uchar uVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  uchar *puVar13;
  int i_1;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  int ok;
  bool bVar19;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      iVar8 = stbi__get16be(z->s);
      iVar8 = iVar8 + -2;
      do {
        if (iVar8 < 1) goto LAB_001111b7;
        psVar2 = z->s;
        pbVar11 = psVar2->img_buffer;
        if (pbVar11 < psVar2->img_buffer_end) {
LAB_00110ee2:
          psVar2->img_buffer = pbVar11 + 1;
          bVar6 = *pbVar11;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            psVar12 = psVar2->buffer_start;
            iVar9 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
            if (iVar9 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar2->img_buffer = psVar12;
              psVar2->img_buffer_end = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
            }
            else {
              psVar2->img_buffer = psVar12;
              psVar2->img_buffer_end = psVar12 + iVar9;
            }
            pbVar11 = psVar2->img_buffer;
            goto LAB_00110ee2;
          }
          bVar6 = 0;
        }
        bVar18 = bVar6 & 0xf;
        if (bVar18 < 4 && bVar6 < 0x20) {
          lVar14 = 0;
          uVar10 = 0;
          do {
            psVar2 = z->s;
            pbVar11 = psVar2->img_buffer;
            if (pbVar11 < psVar2->img_buffer_end) {
LAB_00110fa6:
              psVar2->img_buffer = pbVar11 + 1;
              uVar15 = (uint)*pbVar11;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                psVar12 = psVar2->buffer_start;
                iVar9 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                if (iVar9 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar2->img_buffer = psVar12;
                  psVar2->img_buffer_end = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                }
                else {
                  psVar2->img_buffer = psVar12;
                  psVar2->img_buffer_end = psVar12 + iVar9;
                }
                pbVar11 = psVar2->img_buffer;
                goto LAB_00110fa6;
              }
              uVar15 = 0;
            }
            local_78[lVar14] = uVar15;
            uVar10 = uVar10 + uVar15;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          iVar8 = iVar8 + -0x11;
          if (bVar6 < 0x10) {
            iVar9 = stbi__build_huffman(z->huff_dc + bVar18,(int *)local_78);
            lVar14 = 8;
          }
          else {
            iVar9 = stbi__build_huffman(z->huff_ac + bVar18,(int *)local_78);
            lVar14 = 0x1a48;
          }
          if (iVar9 == 0) goto LAB_001111ab;
          if (uVar10 != 0) {
            uVar17 = 0;
            do {
              psVar2 = z->s;
              psVar12 = psVar2->img_buffer;
              if (psVar12 < psVar2->img_buffer_end) {
LAB_001110b5:
                psVar2->img_buffer = psVar12 + 1;
                sVar3 = *psVar12;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  psVar12 = psVar2->buffer_start;
                  iVar9 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                  if (iVar9 == 0) {
                    psVar2->read_from_callbacks = 0;
                    psVar2->img_buffer = psVar12;
                    psVar2->img_buffer_end = psVar2->buffer_start + 1;
                    psVar2->buffer_start[0] = '\0';
                  }
                  else {
                    psVar2->img_buffer = psVar12;
                    psVar2->img_buffer_end = psVar12 + iVar9;
                  }
                  psVar12 = psVar2->img_buffer;
                  goto LAB_001110b5;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar18].values[uVar17 + lVar14 + -8] = sVar3;
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          if (0xf < bVar6) {
            lVar14 = 0;
            do {
              uVar17 = (ulong)z->huff_ac[bVar18].fast[lVar14];
              z->fast_ac[bVar18][lVar14] = 0;
              if (uVar17 != 0xff) {
                bVar6 = z->huff_ac[bVar18].values[uVar17];
                if ((bVar6 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar18].size[uVar17];
                  uVar7 = (bVar6 & 0xf) + (ushort)bVar1;
                  if (uVar7 < 10) {
                    uVar16 = (int)lVar14 << (bVar1 & 0x1f) & 0x1ff;
                    sVar4 = (sbyte)(bVar6 & 0xf);
                    uVar15 = -1 << sVar4 | 1;
                    if (0xff < uVar16) {
                      uVar15 = 0;
                    }
                    iVar9 = uVar15 + (uVar16 >> (9U - sVar4 & 0x1f));
                    if ((char)iVar9 == iVar9) {
                      z->fast_ac[bVar18][lVar14] = (short)iVar9 * 0x100 | bVar6 & 0xfff0 | uVar7;
                    }
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x200);
          }
          iVar8 = iVar8 - uVar10;
          bVar19 = true;
        }
        else {
          stbi__g_failure_reason = "bad DHT header";
LAB_001111ab:
          bVar19 = false;
        }
      } while (bVar19);
    }
    else if (m == 0xdb) {
      iVar8 = stbi__get16be(z->s);
      iVar8 = iVar8 + -2;
      do {
        if (iVar8 < 1) goto LAB_001111b7;
        psVar2 = z->s;
        pbVar11 = psVar2->img_buffer;
        if (pbVar11 < psVar2->img_buffer_end) {
LAB_00110c89:
          psVar2->img_buffer = pbVar11 + 1;
          bVar6 = *pbVar11;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            psVar12 = psVar2->buffer_start;
            iVar9 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
            if (iVar9 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar2->img_buffer = psVar12;
              psVar2->img_buffer_end = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
            }
            else {
              psVar2->img_buffer = psVar12;
              psVar2->img_buffer_end = psVar12 + iVar9;
            }
            pbVar11 = psVar2->img_buffer;
            goto LAB_00110c89;
          }
          bVar6 = 0;
        }
        if ((bVar6 & 0xf0) == 0x10 || bVar6 < 0x10) {
          if (3 < (bVar6 & 0xf)) {
            stbi__g_failure_reason = "bad DQT table";
            goto LAB_00110cce;
          }
          lVar14 = 0;
          do {
            psVar2 = z->s;
            if (bVar6 < 0x10) {
              pbVar11 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar11) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar7 = 0;
                  goto LAB_00110d87;
                }
                psVar12 = psVar2->buffer_start;
                iVar9 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                if (iVar9 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar2->img_buffer = psVar12;
                  psVar2->img_buffer_end = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                }
                else {
                  psVar2->img_buffer = psVar12;
                  psVar2->img_buffer_end = psVar12 + iVar9;
                }
                pbVar11 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar11 + 1;
              uVar7 = (ushort)*pbVar11;
            }
            else {
              iVar9 = stbi__get16be(psVar2);
              uVar7 = (ushort)iVar9;
            }
LAB_00110d87:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar14] * 2 + (ulong)((bVar6 & 0xf) << 7)) =
                 uVar7;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x40);
          iVar8 = iVar8 + (uint)(bVar6 < 0x10) * 0x40 + -0x81;
          bVar19 = true;
        }
        else {
          stbi__g_failure_reason = "bad DQT type";
LAB_00110cce:
          bVar19 = false;
        }
      } while (bVar19);
    }
    else {
LAB_00110df2:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        uVar10 = stbi__get16be(z->s);
        if (1 < uVar10) {
          if (uVar10 < 7 || m != 0xe0) {
            if (uVar10 < 0xe || m != 0xee) {
              iVar8 = uVar10 - 2;
            }
            else {
              bVar19 = true;
              lVar14 = 0;
              do {
                psVar2 = z->s;
                puVar13 = psVar2->img_buffer;
                if (puVar13 < psVar2->img_buffer_end) {
LAB_00111391:
                  psVar2->img_buffer = puVar13 + 1;
                  uVar5 = *puVar13;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    psVar12 = psVar2->buffer_start;
                    iVar8 = (*(psVar2->io).read)
                                      (psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                    if (iVar8 == 0) {
                      psVar2->read_from_callbacks = 0;
                      psVar2->img_buffer = psVar12;
                      psVar2->img_buffer_end = psVar2->buffer_start + 1;
                      psVar2->buffer_start[0] = '\0';
                    }
                    else {
                      psVar2->img_buffer = psVar12;
                      psVar2->img_buffer_end = psVar12 + iVar8;
                    }
                    puVar13 = psVar2->img_buffer;
                    goto LAB_00111391;
                  }
                  uVar5 = '\0';
                }
                if (uVar5 != "Adobe"[lVar14]) {
                  bVar19 = false;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 6);
              if (bVar19) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar6 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar6;
                iVar8 = uVar10 - 0xe;
              }
              else {
                iVar8 = uVar10 - 8;
              }
            }
          }
          else {
            bVar19 = true;
            lVar14 = 0;
            do {
              psVar2 = z->s;
              puVar13 = psVar2->img_buffer;
              if (puVar13 < psVar2->img_buffer_end) {
LAB_001112a5:
                psVar2->img_buffer = puVar13 + 1;
                uVar5 = *puVar13;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  psVar12 = psVar2->buffer_start;
                  iVar8 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                  if (iVar8 == 0) {
                    psVar2->read_from_callbacks = 0;
                    psVar2->img_buffer = psVar12;
                    psVar2->img_buffer_end = psVar2->buffer_start + 1;
                    psVar2->buffer_start[0] = '\0';
                  }
                  else {
                    psVar2->img_buffer = psVar12;
                    psVar2->img_buffer_end = psVar12 + iVar8;
                  }
                  puVar13 = psVar2->img_buffer;
                  goto LAB_001112a5;
                }
                uVar5 = '\0';
              }
              if (uVar5 != "JFIF"[lVar14]) {
                bVar19 = false;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 5);
            iVar8 = uVar10 - 7;
            if (bVar19) {
              z->jfif = 1;
            }
          }
          stbi__skip(z->s,iVar8);
          goto LAB_00111404;
        }
        if (m == 0xfe) {
          stbi__g_failure_reason = "bad COM len";
        }
        else {
          stbi__g_failure_reason = "bad APP len";
        }
      }
      else {
        stbi__g_failure_reason = "unknown marker";
      }
    }
  }
  else if (m == 0xdd) {
    iVar8 = stbi__get16be(z->s);
    if (iVar8 == 4) {
      iVar8 = stbi__get16be(z->s);
      z->restart_interval = iVar8;
LAB_00111404:
      bVar19 = true;
      goto LAB_001111f5;
    }
    stbi__g_failure_reason = "bad DRI len";
  }
  else {
    if (m != 0xff) goto LAB_00110df2;
    stbi__g_failure_reason = "expected marker";
  }
  bVar19 = false;
LAB_001111f5:
  return (int)bVar19;
LAB_001111b7:
  bVar19 = iVar8 == 0;
  goto LAB_001111f5;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
    int L;
    switch (m)
    {
        case STBI__MARKER_none: // no marker found
            return stbi__err("expected marker", "Corrupt JPEG");

        case 0xDD: // DRI - specify restart interval
            if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len", "Corrupt JPEG");
            z->restart_interval = stbi__get16be(z->s);
            return 1;

        case 0xDB: // DQT - define quantization table
            L = stbi__get16be(z->s) - 2;
            while (L > 0)
            {
                int q = stbi__get8(z->s);
                int p = q >> 4, sixteen = (p != 0);
                int t = q & 15, i;
                if (p != 0 && p != 1) return stbi__err("bad DQT type", "Corrupt JPEG");
                if (t > 3) return stbi__err("bad DQT table", "Corrupt JPEG");

                for (i = 0; i < 64; ++i)
                    z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16) (sixteen ? stbi__get16be(z->s) : stbi__get8(
                            z->s));
                L -= (sixteen ? 129 : 65);
            }
            return L == 0;

        case 0xC4: // DHT - define huffman table
            L = stbi__get16be(z->s) - 2;
            while (L > 0)
            {
                stbi_uc *v;
                int sizes[16], i, n = 0;
                int q = stbi__get8(z->s);
                int tc = q >> 4;
                int th = q & 15;
                if (tc > 1 || th > 3) return stbi__err("bad DHT header", "Corrupt JPEG");
                for (i = 0; i < 16; ++i)
                {
                    sizes[i] = stbi__get8(z->s);
                    n += sizes[i];
                }
                L -= 17;
                if (tc == 0)
                {
                    if (!stbi__build_huffman(z->huff_dc + th, sizes)) return 0;
                    v = z->huff_dc[th].values;
                } else
                {
                    if (!stbi__build_huffman(z->huff_ac + th, sizes)) return 0;
                    v = z->huff_ac[th].values;
                }
                for (i = 0; i < n; ++i)
                    v[i] = stbi__get8(z->s);
                if (tc != 0)
                    stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
                L -= n;
            }
            return L == 0;
    }

    // check for comment block or APP blocks
    if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE)
    {
        L = stbi__get16be(z->s);
        if (L < 2)
        {
            if (m == 0xFE)
                return stbi__err("bad COM len", "Corrupt JPEG");
            else
                return stbi__err("bad APP len", "Corrupt JPEG");
        }
        L -= 2;

        if (m == 0xE0 && L >= 5)
        { // JFIF APP0 segment
            static const unsigned char tag[5] = {'J', 'F', 'I', 'F', '\0'};
            int ok = 1;
            int i;
            for (i = 0; i < 5; ++i)
                if (stbi__get8(z->s) != tag[i])
                    ok = 0;
            L -= 5;
            if (ok)
                z->jfif = 1;
        } else if (m == 0xEE && L >= 12)
        { // Adobe APP14 segment
            static const unsigned char tag[6] = {'A', 'd', 'o', 'b', 'e', '\0'};
            int ok = 1;
            int i;
            for (i = 0; i < 6; ++i)
                if (stbi__get8(z->s) != tag[i])
                    ok = 0;
            L -= 6;
            if (ok)
            {
                stbi__get8(z->s); // version
                stbi__get16be(z->s); // flags0
                stbi__get16be(z->s); // flags1
                z->app14_color_transform = stbi__get8(z->s); // color transform
                L -= 6;
            }
        }

        stbi__skip(z->s, L);
        return 1;
    }

    return stbi__err("unknown marker", "Corrupt JPEG");
}